

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Flow * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::visitSIMDShift
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,SIMDShift *curr)

{
  bool bVar1;
  ExpressionRunner<wasm::ModuleRunner> *pEVar2;
  Literal *pLVar3;
  Literal local_210;
  Literal local_1f8;
  Literal local_1e0;
  Literal local_1c8;
  Literal local_1b0;
  Literal local_198;
  Literal local_180;
  Literal local_168;
  Literal local_150;
  Literal local_138;
  Literal local_120;
  Literal local_108;
  undefined1 local_f0 [8];
  Literal shift;
  undefined1 local_90 [8];
  Literal vec;
  undefined1 local_68 [8];
  Flow flow;
  SIMDShift *curr_local;
  ExpressionRunner<wasm::ModuleRunner> *this_local;
  
  flow.breakTo.super_IString.str._M_str = (char *)curr;
  pEVar2 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
  visit((Flow *)local_68,pEVar2,*(Expression **)(flow.breakTo.super_IString.str._M_str + 0x18));
  bVar1 = Flow::breaking((Flow *)local_68);
  if (bVar1) {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_68);
    vec.type.id._0_4_ = 1;
  }
  else {
    pLVar3 = Flow::getSingleValue((Flow *)local_68);
    ::wasm::Literal::Literal((Literal *)local_90,pLVar3);
    pEVar2 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
    visit((Flow *)&shift.type,pEVar2,*(Expression **)(flow.breakTo.super_IString.str._M_str + 0x20))
    ;
    Flow::operator=((Flow *)local_68,(Flow *)&shift.type);
    Flow::~Flow((Flow *)&shift.type);
    bVar1 = Flow::breaking((Flow *)local_68);
    if (bVar1) {
      Flow::Flow(__return_storage_ptr__,(Flow *)local_68);
      vec.type.id._0_4_ = 1;
    }
    else {
      pLVar3 = Flow::getSingleValue((Flow *)local_68);
      ::wasm::Literal::Literal((Literal *)local_f0,pLVar3);
      switch(*(undefined4 *)(flow.breakTo.super_IString.str._M_str + 0x10)) {
      case 0:
        ::wasm::Literal::shlI8x16(&local_108);
        Flow::Flow(__return_storage_ptr__,&local_108);
        ::wasm::Literal::~Literal(&local_108);
        break;
      case 1:
        ::wasm::Literal::shrSI8x16(&local_120);
        Flow::Flow(__return_storage_ptr__,&local_120);
        ::wasm::Literal::~Literal(&local_120);
        break;
      case 2:
        ::wasm::Literal::shrUI8x16(&local_138);
        Flow::Flow(__return_storage_ptr__,&local_138);
        ::wasm::Literal::~Literal(&local_138);
        break;
      case 3:
        ::wasm::Literal::shlI16x8(&local_150);
        Flow::Flow(__return_storage_ptr__,&local_150);
        ::wasm::Literal::~Literal(&local_150);
        break;
      case 4:
        ::wasm::Literal::shrSI16x8(&local_168);
        Flow::Flow(__return_storage_ptr__,&local_168);
        ::wasm::Literal::~Literal(&local_168);
        break;
      case 5:
        ::wasm::Literal::shrUI16x8(&local_180);
        Flow::Flow(__return_storage_ptr__,&local_180);
        ::wasm::Literal::~Literal(&local_180);
        break;
      case 6:
        ::wasm::Literal::shlI32x4(&local_198);
        Flow::Flow(__return_storage_ptr__,&local_198);
        ::wasm::Literal::~Literal(&local_198);
        break;
      case 7:
        ::wasm::Literal::shrSI32x4(&local_1b0);
        Flow::Flow(__return_storage_ptr__,&local_1b0);
        ::wasm::Literal::~Literal(&local_1b0);
        break;
      case 8:
        ::wasm::Literal::shrUI32x4(&local_1c8);
        Flow::Flow(__return_storage_ptr__,&local_1c8);
        ::wasm::Literal::~Literal(&local_1c8);
        break;
      case 9:
        ::wasm::Literal::shlI64x2(&local_1e0);
        Flow::Flow(__return_storage_ptr__,&local_1e0);
        ::wasm::Literal::~Literal(&local_1e0);
        break;
      case 10:
        ::wasm::Literal::shrSI64x2(&local_1f8);
        Flow::Flow(__return_storage_ptr__,&local_1f8);
        ::wasm::Literal::~Literal(&local_1f8);
        break;
      case 0xb:
        ::wasm::Literal::shrUI64x2(&local_210);
        Flow::Flow(__return_storage_ptr__,&local_210);
        ::wasm::Literal::~Literal(&local_210);
        break;
      default:
        ::wasm::handle_unreachable
                  ("invalid op",
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                   ,0x54b);
      }
      vec.type.id._0_4_ = 1;
      ::wasm::Literal::~Literal((Literal *)local_f0);
    }
    ::wasm::Literal::~Literal((Literal *)local_90);
  }
  Flow::~Flow((Flow *)local_68);
  return __return_storage_ptr__;
}

Assistant:

Flow visitSIMDShift(SIMDShift* curr) {
    NOTE_ENTER("SIMDShift");
    Flow flow = self()->visit(curr->vec);
    if (flow.breaking()) {
      return flow;
    }
    Literal vec = flow.getSingleValue();
    flow = self()->visit(curr->shift);
    if (flow.breaking()) {
      return flow;
    }
    Literal shift = flow.getSingleValue();
    switch (curr->op) {
      case ShlVecI8x16:
        return vec.shlI8x16(shift);
      case ShrSVecI8x16:
        return vec.shrSI8x16(shift);
      case ShrUVecI8x16:
        return vec.shrUI8x16(shift);
      case ShlVecI16x8:
        return vec.shlI16x8(shift);
      case ShrSVecI16x8:
        return vec.shrSI16x8(shift);
      case ShrUVecI16x8:
        return vec.shrUI16x8(shift);
      case ShlVecI32x4:
        return vec.shlI32x4(shift);
      case ShrSVecI32x4:
        return vec.shrSI32x4(shift);
      case ShrUVecI32x4:
        return vec.shrUI32x4(shift);
      case ShlVecI64x2:
        return vec.shlI64x2(shift);
      case ShrSVecI64x2:
        return vec.shrSI64x2(shift);
      case ShrUVecI64x2:
        return vec.shrUI64x2(shift);
    }
    WASM_UNREACHABLE("invalid op");
  }